

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLog.c
# Opt level: O0

int Abc_NtkReadLogFile(char *pFileName,Abc_Cex_t **ppCex,int *pnFrames)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  Abc_Cex_t *pAVar4;
  int local_464;
  int local_45c;
  int iFrameCex_1;
  int iFrameCex;
  int nFrames2;
  int Status;
  int iPo;
  int nFrames;
  int nRegs;
  int c;
  char *RetValue;
  char *pToken;
  char Buffer [1000];
  Vec_Int_t *vNums;
  Abc_Cex_t *pCex;
  FILE *pFile;
  int *pnFrames_local;
  Abc_Cex_t **ppCex_local;
  char *pFileName_local;
  
  Status = -1;
  nFrames2 = -1;
  iFrameCex_1 = -1;
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open log file for reading \"%s\".\n",pFileName);
    return -1;
  }
  fgets((char *)&pToken,1000,__stream);
  iVar1 = strncmp((char *)&pToken,"snl_UNSAT",9);
  if (iVar1 == 0) {
    iFrameCex = 1;
    Status = atoi(Buffer + 1);
  }
  else {
    iVar1 = strncmp((char *)&pToken,"snl_SAT",7);
    if (iVar1 == 0) {
      iFrameCex = 0;
      pcVar3 = strtok((char *)((long)&pToken + 7)," \t\n");
      Status = atoi(pcVar3);
      strtok((char *)0x0," \t\n");
      pcVar3 = strtok((char *)0x0," \t\n");
      if (pcVar3 != (char *)0x0) {
        nFrames2 = atoi(pcVar3);
        pcVar3 = strtok((char *)0x0," \t\n");
        if (pcVar3 != (char *)0x0) {
          iFrameCex_1 = atoi(pcVar3);
        }
      }
    }
    else {
      iVar1 = strncmp((char *)&pToken,"snl_UNK",7);
      if (iVar1 == 0) {
        Status = atoi((char *)((long)&pToken + 7));
      }
      else {
        printf("Unrecognized status.\n");
      }
      iFrameCex = -1;
    }
  }
  Buffer._992_8_ = Vec_IntAlloc(100);
  while ((iVar1 = fgetc(__stream), iVar1 != -1 && (iVar1 != 10))) {
    if ((iVar1 == 0x30) || (iVar1 == 0x31)) {
      Vec_IntPush((Vec_Int_t *)Buffer._992_8_,iVar1 + -0x30);
    }
  }
  iVar1 = Vec_IntSize((Vec_Int_t *)Buffer._992_8_);
  while (iVar2 = fgetc(__stream), iVar2 != -1) {
    if ((iVar2 == 0x30) || (iVar2 == 0x31)) {
      Vec_IntPush((Vec_Int_t *)Buffer._992_8_,iVar2 + -0x30);
    }
  }
  fclose(__stream);
  iVar2 = Vec_IntSize((Vec_Int_t *)Buffer._992_8_);
  if (iVar2 == 0) {
    if (iFrameCex_1 == -1) {
      local_464 = Status;
    }
    else {
      local_464 = iFrameCex_1;
    }
    pAVar4 = Abc_CexAlloc(0,0,local_464 + 1);
    pAVar4->iFrame = local_464;
    pAVar4->iPo = nFrames2;
    if (ppCex != (Abc_Cex_t **)0x0) {
      *ppCex = pAVar4;
    }
    Vec_IntFree((Vec_Int_t *)Buffer._992_8_);
  }
  else {
    if (iFrameCex_1 == -1) {
      local_45c = Status;
    }
    else {
      local_45c = iFrameCex_1;
    }
    if (iVar1 < 0) {
      printf("Cannot read register number.\n");
      Vec_IntFree((Vec_Int_t *)Buffer._992_8_);
      return -1;
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)Buffer._992_8_);
    if (iVar2 == iVar1) {
      printf("Cannot read counter example.\n");
      Vec_IntFree((Vec_Int_t *)Buffer._992_8_);
      return -1;
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)Buffer._992_8_);
    if ((iVar2 - iVar1) % (local_45c + 1) != 0) {
      printf("Incorrect number of bits.\n");
      Vec_IntFree((Vec_Int_t *)Buffer._992_8_);
      return -1;
    }
    iVar2 = Vec_IntSize((Vec_Int_t *)Buffer._992_8_);
    pAVar4 = Abc_CexAlloc(iVar1,(iVar2 - iVar1) / (local_45c + 1),local_45c + 1);
    pAVar4->iPo = nFrames2;
    pAVar4->iFrame = local_45c;
    iVar1 = Vec_IntSize((Vec_Int_t *)Buffer._992_8_);
    if (iVar1 != pAVar4->nBits) {
      __assert_fail("Vec_IntSize(vNums) == pCex->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcLog.c"
                    ,0xdb,"int Abc_NtkReadLogFile(char *, Abc_Cex_t **, int *)");
    }
    for (nFrames = 0; nFrames < pAVar4->nBits; nFrames = nFrames + 1) {
      iVar1 = Vec_IntEntry((Vec_Int_t *)Buffer._992_8_,nFrames);
      if (iVar1 != 0) {
        Abc_InfoSetBit((uint *)(pAVar4 + 1),nFrames);
      }
    }
    Vec_IntFree((Vec_Int_t *)Buffer._992_8_);
    if (ppCex == (Abc_Cex_t **)0x0) {
      if (pAVar4 != (Abc_Cex_t *)0x0) {
        free(pAVar4);
      }
    }
    else {
      *ppCex = pAVar4;
    }
  }
  if (pnFrames != (int *)0x0) {
    *pnFrames = Status;
  }
  return iFrameCex;
}

Assistant:

int Abc_NtkReadLogFile( char * pFileName, Abc_Cex_t ** ppCex, int * pnFrames )
{
    FILE * pFile;
    Abc_Cex_t * pCex;
    Vec_Int_t * vNums;
    char Buffer[1000], * pToken, * RetValue;
    int c, nRegs = -1, nFrames = -1, iPo = -1, Status = -1, nFrames2 = -1;
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open log file for reading \"%s\".\n" , pFileName );
        return -1;
    }
    RetValue = fgets( Buffer, 1000, pFile );
    if ( !strncmp( Buffer, "snl_UNSAT", strlen("snl_UNSAT") ) )
    {
        Status = 1;
        nFrames = atoi( Buffer + strlen("snl_UNSAT") ); 
    }
    else if ( !strncmp( Buffer, "snl_SAT", strlen("snl_SAT") ) )
    {
        Status = 0;
//        nFrames = atoi( Buffer + strlen("snl_SAT") ); 
        pToken  = strtok( Buffer + strlen("snl_SAT"), " \t\n" );
        nFrames = atoi( pToken ); 
        pToken  = strtok( NULL, " \t\n" );
        pToken  = strtok( NULL, " \t\n" );
        if ( pToken != NULL )
        {
            iPo     = atoi( pToken ); 
            pToken  = strtok( NULL, " \t\n" );
            if ( pToken )
                nFrames2 = atoi( pToken ); 
        }
//        else
//            printf( "Warning! The current status is SAT but the current CEX is not given.\n"  );
    }
    else if ( !strncmp( Buffer, "snl_UNK", strlen("snl_UNK") ) )
    {
        Status = -1;
        nFrames = atoi( Buffer + strlen("snl_UNK") ); 
    }
    else
    {
        printf( "Unrecognized status.\n" );
    }
    // found regs till the new line
    vNums = Vec_IntAlloc( 100 );
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '\n' )
            break;
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    nRegs = Vec_IntSize(vNums);
    // skip till the new line
    while ( (c = fgetc(pFile)) != EOF )
    {
        if ( c == '0' || c == '1' )
            Vec_IntPush( vNums, c - '0' );
    }
    fclose( pFile );
    if ( Vec_IntSize(vNums) )
    {
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        if ( nRegs < 0 )
        {
            printf( "Cannot read register number.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( Vec_IntSize(vNums)-nRegs == 0 )
        {
            printf( "Cannot read counter example.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        if ( (Vec_IntSize(vNums)-nRegs) % (iFrameCex + 1) != 0 )
        {
            printf( "Incorrect number of bits.\n" );
            Vec_IntFree( vNums );
            return -1;
        }
        pCex = Abc_CexAlloc( nRegs, (Vec_IntSize(vNums)-nRegs)/(iFrameCex + 1), iFrameCex + 1 );
        pCex->iPo    = iPo;
        pCex->iFrame = iFrameCex;
        assert( Vec_IntSize(vNums) == pCex->nBits );
        for ( c = 0; c < pCex->nBits; c++ )
            if ( Vec_IntEntry(vNums, c) )
                Abc_InfoSetBit( pCex->pData, c );
        Vec_IntFree( vNums );
        if ( ppCex )
            *ppCex = pCex;
        else
            ABC_FREE( pCex );
    }
    else
    {                                                         
        // corner case of seq circuit with no PIs             
        int iFrameCex = (nFrames2 == -1) ? nFrames : nFrames2;
        pCex = Abc_CexAlloc( 0, 0, iFrameCex + 1 );           
        pCex->iFrame = iFrameCex;                             
        pCex->iPo    = iPo;                                   
        if ( ppCex )                                          
            *ppCex = pCex;                                    
        Vec_IntFree( vNums );                                 
    }                                                         
    if ( pnFrames )
        *pnFrames = nFrames;
    return Status;
}